

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_callin.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  dlog_mt_call_in_params_t *call_in_params;
  FILE *pFVar3;
  size_t sVar4;
  
  if (argc < 2) {
    printf("Usage:\n\tmm_callin mm_table_%02x.bin [outputfile.bin]\n",0x23);
    return -1;
  }
  pcVar2 = table_to_string('#');
  printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n",pcVar2,0x23,0x23);
  call_in_params = (dlog_mt_call_in_params_t *)calloc(1,0x15);
  if (call_in_params == (dlog_mt_call_in_params_t *)0x0) {
    printf("Failed to allocate %zu bytes.\n",0x15);
    return -0xc;
  }
  pFVar3 = fopen(argv[1],"rb");
  if (pFVar3 == (FILE *)0x0) {
    printf("Error opening %s\n",argv[1]);
    free(call_in_params);
LAB_00104399:
    iVar1 = -2;
  }
  else {
    iVar1 = mm_validate_table_fsize('#',(FILE *)pFVar3,0x14);
    if (iVar1 == 0) {
      sVar4 = fread(call_in_params->call_in_start_date,0x14,1,pFVar3);
      if (sVar4 == 1) {
        fclose(pFVar3);
        print_call_in_params_table(call_in_params);
        iVar1 = 0;
        if (argc == 2) {
LAB_00104360:
          free(call_in_params);
          return iVar1;
        }
        pFVar3 = fopen(argv[2],"wb");
        if (pFVar3 != (FILE *)0x0) {
          iVar1 = 0;
          printf("\nWriting new table to %s\n",argv[2]);
          sVar4 = fwrite(call_in_params->call_in_start_date,0x14,1,pFVar3);
          if (sVar4 != 1) {
            printf("Error writing output file %s\n",argv[2]);
            iVar1 = -5;
          }
          fclose(pFVar3);
          goto LAB_00104360;
        }
        printf("Error opening output file %s for write.\n",argv[2]);
        goto LAB_00104399;
      }
      pcVar2 = table_to_string('#');
      printf("Error reading %s table.\n",pcVar2);
    }
    free(call_in_params);
    fclose(pFVar3);
    iVar1 = -5;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    int   ret = 0;

    dlog_mt_call_in_params_t *ptable;
    uint8_t* load_buffer;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_callin mm_table_%02x.bin [outputfile.bin]\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n", table_to_string(TABLE_ID), TABLE_ID, TABLE_ID);

    ptable = (dlog_mt_call_in_params_t *)calloc(1, sizeof(dlog_mt_call_in_params_t));

    if (ptable == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_call_in_params_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(ptable);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_call_in_params_t) - 1) != 0) {
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    load_buffer = ((uint8_t*)ptable) + 1;
    if (fread(load_buffer, sizeof(dlog_mt_call_in_params_t) - 1, 1, instream) != 1) {
        printf("Error reading %s table.\n", table_to_string(TABLE_ID));
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    print_call_in_params_table(ptable);

    if (argc > 2) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            return -ENOENT;
        }
    }

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s\n", argv[2]);

        if (fwrite(load_buffer, sizeof(dlog_mt_call_in_params_t) - 1, 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    if (ptable != NULL) {
        free(ptable);
    }

    return ret;
}